

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O0

void __thiscall
TPZTensor<TFad<6,_double>_>::Multiply
          (TPZTensor<TFad<6,_double>_> *this,TPZTensor<TFad<6,_double>_> *tensor,
          TPZTensor<TFad<6,_double>_> *resp)

{
  TFad<6,_double> *e1;
  TFad<6,_double> *e2;
  TFad<6,_double> *this_00;
  TFad<6,_double> *fadexpr;
  long in_RDX;
  long in_RDI;
  TFad<6,_double> YZ;
  TFad<6,_double> XZ;
  TFad<6,_double> XY;
  TFad<6,_double> ZZ;
  TFad<6,_double> YY;
  TFad<6,_double> XX;
  TFad<6,_double> *in_stack_fffffffffffffb88;
  TFad<6,_double> *in_stack_fffffffffffffb90;
  TFad<6,_double> *in_stack_fffffffffffffbb0;
  TFad<6,_double> *in_stack_fffffffffffffbb8;
  
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),0);
  TFad<6,_double>::TFad(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),3);
  TFad<6,_double>::TFad(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),5);
  TFad<6,_double>::TFad(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),1);
  TFad<6,_double>::TFad(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),2);
  TFad<6,_double>::TFad(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDI + 8),4);
  TFad<6,_double>::TFad(in_stack_fffffffffffffb90,in_stack_fffffffffffffb88);
  TPZTensor<TFad<6,_double>_>::XX((TPZTensor<TFad<6,_double>_> *)0x14b6db8);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  TPZTensor<TFad<6,_double>_>::XY((TPZTensor<TFad<6,_double>_> *)0x14b6dee);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  ::operator+((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb8,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb0);
  TPZTensor<TFad<6,_double>_>::XZ((TPZTensor<TFad<6,_double>_> *)0x14b6e43);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)in_stack_fffffffffffffbb8,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDX + 8),0);
  TFad<6,double>::operator=
            (in_stack_fffffffffffffb90,
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
              *)in_stack_fffffffffffffb88);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b6ece);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b6edb);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b6ee8);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b6ef5);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b6f02);
  TPZTensor<TFad<6,_double>_>::XY((TPZTensor<TFad<6,_double>_> *)0x14b6f0f);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  TPZTensor<TFad<6,_double>_>::YY((TPZTensor<TFad<6,_double>_> *)0x14b6f45);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  ::operator+((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb8,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb0);
  TPZTensor<TFad<6,_double>_>::YZ((TPZTensor<TFad<6,_double>_> *)0x14b6f9a);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)in_stack_fffffffffffffbb8,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDX + 8),3);
  TFad<6,double>::operator=
            (in_stack_fffffffffffffb90,
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
              *)in_stack_fffffffffffffb88);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b7026);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b7033);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b7040);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b704d);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b705a);
  TPZTensor<TFad<6,_double>_>::XZ((TPZTensor<TFad<6,_double>_> *)0x14b7067);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  TPZTensor<TFad<6,_double>_>::YZ((TPZTensor<TFad<6,_double>_> *)0x14b7097);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  ::operator+((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb8,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb0);
  TPZTensor<TFad<6,_double>_>::ZZ((TPZTensor<TFad<6,_double>_> *)0x14b70e6);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)in_stack_fffffffffffffbb8,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb0);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDX + 8),5);
  TFad<6,double>::operator=
            (in_stack_fffffffffffffb90,
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
              *)in_stack_fffffffffffffb88);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b7166);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b7173);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b7180);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b718d);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b719a);
  TPZTensor<TFad<6,_double>_>::XY((TPZTensor<TFad<6,_double>_> *)0x14b71a7);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  TPZTensor<TFad<6,_double>_>::YY((TPZTensor<TFad<6,_double>_> *)0x14b71d7);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  ::operator+((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb8,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb0);
  TPZTensor<TFad<6,_double>_>::YZ((TPZTensor<TFad<6,_double>_> *)0x14b7226);
  ::operator*(in_stack_fffffffffffffbb8,in_stack_fffffffffffffbb0);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)in_stack_fffffffffffffbb8,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)
              in_stack_fffffffffffffbb0);
  e1 = TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDX + 8),1);
  TFad<6,double>::operator=
            (in_stack_fffffffffffffb90,
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
              *)in_stack_fffffffffffffb88);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b72a6);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b72b3);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b72c0);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b72cd);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b72da);
  e2 = TPZTensor<TFad<6,_double>_>::XZ((TPZTensor<TFad<6,_double>_> *)0x14b72e7);
  ::operator*(e1,e2);
  TPZTensor<TFad<6,_double>_>::YZ((TPZTensor<TFad<6,_double>_> *)0x14b7317);
  ::operator*(e1,e2);
  ::operator+((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e1,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e2);
  TPZTensor<TFad<6,_double>_>::ZZ((TPZTensor<TFad<6,_double>_> *)0x14b7366);
  ::operator*(e1,e2);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)e1,(TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDX + 8),2);
  TFad<6,double>::operator=
            (in_stack_fffffffffffffb90,
             (TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
              *)in_stack_fffffffffffffb88);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b73e6);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b73f3);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b7400);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b740d);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b741a);
  this_00 = TPZTensor<TFad<6,_double>_>::XZ((TPZTensor<TFad<6,_double>_> *)0x14b7427);
  ::operator*(e1,e2);
  fadexpr = TPZTensor<TFad<6,_double>_>::YZ((TPZTensor<TFad<6,_double>_> *)0x14b7457);
  ::operator*(e1,e2);
  ::operator+((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e1,
              (TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e2);
  TPZTensor<TFad<6,_double>_>::ZZ((TPZTensor<TFad<6,_double>_> *)0x14b74a6);
  ::operator*(e1,e2);
  ::operator+((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)e1,(TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)e2);
  TPZVec<TFad<6,_double>_>::operator[]((TPZVec<TFad<6,_double>_> *)(in_RDX + 8),4);
  TFad<6,double>::operator=
            (this_00,(TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
                      *)fadexpr);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b7524);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b7531);
  TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
  ::~TFadExpr((TFadExpr<TFadBinaryAdd<TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>,_TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>_>_>
               *)0x14b753e);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b754b);
  TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_>::~TFadExpr
            ((TFadExpr<TFadBinaryMul<TFad<6,_double>,_TFad<6,_double>_>_> *)0x14b7558);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b7565);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b7572);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b757f);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b758c);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b7599);
  TFad<6,_double>::~TFad((TFad<6,_double> *)0x14b75a6);
  return;
}

Assistant:

void TPZTensor<T>::Multiply(const TPZTensor<T> tensor, TPZTensor<T> & resp) const {
    const T XX = this->fData[_XX_];
    const T YY = this->fData[_YY_];
    const T ZZ = this->fData[_ZZ_];
    const T XY = this->fData[_XY_];
    const T XZ = this->fData[_XZ_];
    const T YZ = this->fData[_YZ_];
    resp.fData[_XX_] = XX * tensor.XX() + XY * tensor.XY() + XZ * tensor.XZ();
    resp.fData[_YY_] = XY * tensor.XY() + YY * tensor.YY() + YZ * tensor.YZ();
    resp.fData[_ZZ_] = XZ * tensor.XZ() + YZ * tensor.YZ() + ZZ * tensor.ZZ();
    resp.fData[_XY_] = XX * tensor.XY() + XY * tensor.YY() + XZ * tensor.YZ();
    resp.fData[_XZ_] = XX * tensor.XZ() + XY * tensor.YZ() + XZ * tensor.ZZ();
    resp.fData[_YZ_] = XY * tensor.XZ() + YY * tensor.YZ() + YZ * tensor.ZZ();
}